

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall
rcg::Stream::Stream(Stream *this,shared_ptr<rcg::Device> *_parent,
                   shared_ptr<const_rcg::GenTLWrapper> *_gentl,char *_id)

{
  char *pcVar1;
  
  (this->super_enable_shared_from_this<rcg::Stream>)._M_weak_this.
  super___weak_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rcg::Stream>)._M_weak_this.
  super___weak_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Buffer::Buffer(&this->buffer,_gentl,this);
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->mtx).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_parent->super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,&(_parent->super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(_gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  pcVar1 = (char *)(this->id)._M_string_length;
  strlen(_id);
  std::__cxx11::string::_M_replace((ulong)&this->id,0,pcVar1,(ulong)_id);
  this->n_open = 0;
  this->stream = (void *)0x0;
  this->event = (void *)0x0;
  this->bn = 0;
  return;
}

Assistant:

Stream::Stream(const std::shared_ptr<Device> &_parent,
               const std::shared_ptr<const GenTLWrapper> &_gentl, const char *_id) :
               buffer(_gentl, this)
{
  parent=_parent;
  gentl=_gentl;
  id=_id;

  n_open=0;
  stream=0;
  event=0;
  bn=0;
}